

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::BayesianProbitRegressor_Gaussian::SharedCtor
          (BayesianProbitRegressor_Gaussian *this)

{
  BayesianProbitRegressor_Gaussian *this_local;
  
  memset(&this->mean_,0,0x10);
  return;
}

Assistant:

inline void BayesianProbitRegressor_Gaussian::SharedCtor() {
::memset(reinterpret_cast<char*>(this) + static_cast<size_t>(
    reinterpret_cast<char*>(&mean_) - reinterpret_cast<char*>(this)),
    0, static_cast<size_t>(reinterpret_cast<char*>(&precision_) -
    reinterpret_cast<char*>(&mean_)) + sizeof(precision_));
}